

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_dup32_arm(void *d,uint32_t desc,uint32_t c)

{
  undefined8 local_28;
  intptr_t i;
  intptr_t oprsz;
  uint32_t c_local;
  uint32_t desc_local;
  void *d_local;
  
  i = simd_oprsz(desc);
  if (c == 0) {
    i = 0;
  }
  else {
    for (local_28 = 0; local_28 < i; local_28 = local_28 + 4) {
      *(uint32_t *)((long)d + local_28) = c;
    }
  }
  clear_high(d,i,desc);
  return;
}

Assistant:

void HELPER(gvec_dup32)(void *d, uint32_t desc, uint32_t c)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    if (c == 0) {
        oprsz = 0;
    } else {
        for (i = 0; i < oprsz; i += sizeof(uint32_t)) {
            *(uint32_t *)((char *)d + i) = c;
        }
    }
    clear_high(d, oprsz, desc);
}